

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

error_info *
toml::detail::make_syntax_error<toml::detail::repeat_at_least>
          (string *title,repeat_at_least *scanner,location *loc,string *suffix)

{
  error_info *in_RDI;
  source_location src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  source_location *in_stack_fffffffffffffd78;
  region *in_stack_fffffffffffffd80;
  source_location *this;
  error_info *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  location *in_stack_fffffffffffffde8;
  region *in_stack_fffffffffffffdf0;
  region *in_stack_fffffffffffffdf8;
  source_location *in_stack_fffffffffffffe00;
  location *in_stack_fffffffffffffe20;
  repeat_at_least *in_stack_fffffffffffffe28;
  source_location local_1a0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  source_location *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69 [3];
  
  this_00 = local_69;
  __lhs = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)__lhs,(allocator<char> *)in_RDI);
  repeat_at_least::expected_chars_abi_cxx11_(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd80);
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  region::region(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  source_location::source_location(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  region::~region(in_stack_fffffffffffffd80);
  this = local_1a0;
  std::__cxx11::string::string
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
  source_location::source_location(this,in_stack_fffffffffffffd78);
  std::__cxx11::string::string
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
  make_error_info<std::__cxx11::string>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return __lhs;
}

Assistant:

error_info make_syntax_error(std::string title,
        const S& scanner, location loc, std::string suffix = "")
{
    auto msg = std::string("expected ") + scanner.expected_chars(loc);
    auto src = source_location(region(loc));
    return make_error_info(
        std::move(title), std::move(src), std::move(msg), std::move(suffix));
}